

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventStream.cpp
# Opt level: O3

Event * __thiscall binlog::EventStream::nextEvent(EventStream *this,EntryStream *input)

{
  uint64_t eventSourceId;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint64_t *extraout_RDX;
  uint64_t *extraout_RDX_00;
  Range range;
  Range range_00;
  Range range_01;
  Range range_02;
  Range local_28;
  
  iVar1 = (*input->_vptr_EntryStream[2])(input);
  local_28._begin = (char *)CONCAT44(extraout_var,iVar1);
  local_28._end = (char *)extraout_RDX;
  if ((uint64_t *)local_28._begin != extraout_RDX) {
    do {
      Range::throw_if_overflow(&local_28,8);
      eventSourceId = *(uint64_t *)local_28._begin;
      local_28._begin = (char *)((long)local_28._begin + 8);
      if (-1 < (long)eventSourceId) {
        range_02._end = local_28._end;
        range_02._begin = local_28._begin;
        readEvent(this,eventSourceId,range_02);
        return &this->_event;
      }
      if (eventSourceId == 0xfffffffffffffffd) {
        range_01._end = local_28._end;
        range_01._begin = local_28._begin;
        readClockSync(this,range_01);
      }
      else if (eventSourceId == 0xfffffffffffffffe) {
        range_00._end = local_28._end;
        range_00._begin = local_28._begin;
        readWriterProp(this,range_00);
      }
      else if (eventSourceId == 0xffffffffffffffff) {
        range._end = local_28._end;
        range._begin = local_28._begin;
        readEventSource(this,range);
      }
      iVar1 = (*input->_vptr_EntryStream[2])(input);
      local_28._begin = (char *)CONCAT44(extraout_var_00,iVar1);
      local_28._end = (char *)extraout_RDX_00;
    } while ((uint64_t *)local_28._begin != extraout_RDX_00);
  }
  return (Event *)0x0;
}

Assistant:

const Event* EventStream::nextEvent(EntryStream& input)
{
  while (true)
  {
    Range range = input.nextEntryPayload();
    if (range.empty()) { return nullptr; }

    const std::uint64_t tag = range.read<std::uint64_t>();
    const bool special = (tag & (std::uint64_t(1) << 63)) != 0;

    if (special)
    {
      switch (tag)
      {
        case EventSource::Tag:
          readEventSource(range);
          break;
        case WriterProp::Tag:
          readWriterProp(range);
          break;
        case ClockSync::Tag:
          readClockSync(range);
          break;
        // default: ignore unkown special entries
        // to be forward compatible.
      }
    }
    else
    {
      readEvent(tag, range);
      return &_event;
    }
  }
}